

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.h
# Opt level: O1

void __thiscall ast::Dir_equ::~Dir_equ(Dir_equ *this)

{
  pointer pcVar1;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bf38;
  pcVar1 = (this->super_Directive).super_Statement.label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Directive).super_Statement.label.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

string listing() {
		return string_printf("%4d%10c\t", location.line, ' ');
	}